

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeInvocationsTestInstance *this)

{
  long *plVar1;
  int *piVar2;
  pointer pPVar3;
  VkDeviceSize VVar4;
  deUint32 _queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  uint *puVar5;
  VkPhysicalDeviceProperties *pVVar6;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong _size;
  SharedPtr<vkt::Draw::Buffer> buffer;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkDescriptorSetAllocateInfo allocateParams;
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  VkDescriptorBufferInfo descriptorInfo;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  Allocation *local_1a8;
  long *local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  pointer local_178;
  VkDescriptorPool VStack_170;
  VkBufferUsageFlags local_168;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  pointer local_148;
  pointer local_140;
  undefined1 local_138 [24];
  VkAllocationCallbacks *pVStack_120;
  VkAllocationCallbacks *local_118;
  deUint64 local_108;
  pointer pWStack_100;
  pointer local_f8;
  VkAllocationCallbacks *pVStack_f0;
  VkDescriptorPool local_e8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_e0;
  VkPipelineLayout local_c8;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_c0;
  undefined1 local_a8 [16];
  pointer local_98;
  VkAllocationCallbacks *pVStack_90;
  PFN_vkInternalFreeNotification local_80;
  undefined8 local_78;
  ulong local_70;
  Move<vk::Handle<(vk::HandleType)24>_> local_68;
  VkCommandPoolCreateInfo local_48;
  
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  vk = Context::getDeviceInterface
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)
  ;
  pPVar3 = (this->m_parameters->
           super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->m_parameters->
                super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3;
  if (lVar9 == 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = (lVar9 >> 3) * 0x6db6db6db6db6db7;
    lVar9 = lVar9 + (ulong)(lVar9 == 0);
    puVar5 = (pPVar3->groupSize).m_data + 2;
    uVar7 = 0;
    do {
      uVar8 = puVar5[-4] * puVar5[-5] * puVar5[-3] * ((UVec3 *)(puVar5 + -2))->m_data[0] *
              puVar5[-1] * *puVar5;
      if (uVar8 < uVar7) {
        uVar8 = uVar7;
      }
      uVar7 = uVar8;
      puVar5 = puVar5 + 0xe;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    lVar9 = (ulong)uVar7 * 4 + -1;
  }
  pVVar6 = Context::getDeviceProperties
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  VVar4 = (pVVar6->limits).nonCoherentAtomSize;
  _size = -VVar4 & lVar9 + VVar4;
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)local_188,_size,0x20,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0)
  ;
  allocator = Context::getDefaultAllocator
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_198,vk,device,(VkBufferCreateInfo *)local_188,allocator,
             (MemoryRequirement)0x1);
  if (local_150 != (pointer)0x0) {
    operator_delete(local_150,(long)local_140 - (long)local_150);
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_188);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_188,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,
                       0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_138,this_00,vk,device,0);
  local_98 = (pointer)local_138._16_8_;
  pVStack_90 = pVStack_120;
  local_a8._0_8_ = local_138._0_8_;
  local_a8._8_8_ = local_138._8_8_;
  local_138._0_8_ = (void *)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = (pointer)0x0;
  pVStack_120 = (VkAllocationCallbacks *)0x0;
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  if ((VkAllocationCallbacks *)VStack_170.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_170.m_internal,(long)local_160 - VStack_170.m_internal);
  }
  if ((void *)local_188._0_8_ != (void *)0x0) {
    operator_delete((void *)local_188._0_8_,(long)local_178 - local_188._0_8_);
  }
  local_188._0_4_ = 0x1e;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x100000000;
  local_168 = 0;
  local_160 = (pointer)0x0;
  VStack_170.m_internal = (deUint64)local_a8;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_138,vk,device,
             (VkPipelineLayoutCreateInfo *)local_188,(VkAllocationCallbacks *)0x0);
  local_c8.m_internal = local_138._0_8_;
  DStack_c0.m_deviceIface = (DeviceInterface *)local_138._8_8_;
  DStack_c0.m_device = (VkDevice)local_138._16_8_;
  DStack_c0.m_allocator = pVStack_120;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_138);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_138,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_188,this_01,vk,device,1,1);
  DStack_e0.m_device = (VkDevice)local_178;
  DStack_e0.m_allocator = (VkAllocationCallbacks *)VStack_170.m_internal;
  local_e8.m_internal = local_188._0_8_;
  DStack_e0.m_deviceIface = (DeviceInterface *)local_188._8_8_;
  local_188._0_8_ = 0;
  local_188._8_8_ = (pointer)0x0;
  local_178 = (pointer)0x0;
  VStack_170.m_internal = 0;
  if ((void *)local_138._0_8_ != (void *)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  local_138._0_4_ = 0x22;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = local_e8.m_internal;
  pVStack_120 = (VkAllocationCallbacks *)CONCAT44(pVStack_120._4_4_,1);
  local_118 = (VkAllocationCallbacks *)local_a8;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_188,vk,device,
             (VkDescriptorSetAllocateInfo *)local_138);
  local_f8 = local_178;
  pVStack_f0 = (VkAllocationCallbacks *)VStack_170.m_internal;
  local_108 = local_188._0_8_;
  pWStack_100 = (pointer)local_188._8_8_;
  local_80 = *(PFN_vkInternalFreeNotification *)(local_198._0_8_ + 0x10);
  local_78 = 0;
  local_70 = _size;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_188);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)local_188,(int)local_108,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  if ((VkAllocationCallbacks *)VStack_170.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_170.m_internal,(long)local_160 - VStack_170.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)local_188);
  _queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo((CmdPoolCreateInfo *)&local_48,_queueFamilyIndex,2);
  ::vk::createCommandPool(&local_68,vk,device,&local_48,(VkAllocationCallbacks *)0x0);
  local_188._4_4_ =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_;
  local_188._0_4_ =
       (undefined4)local_68.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  local_1a8 = (Allocation *)local_198._0_8_;
  local_1a0 = (long *)local_198._8_8_;
  if ((long *)local_198._8_8_ != (long *)0x0) {
    LOCK();
    *(int *)(local_198._8_8_ + 8) = (int)*(long *)(local_198._8_8_ + 8) + 1;
    UNLOCK();
    LOCK();
    *(int *)(local_198._8_8_ + 0xc) = *(int *)(local_198._8_8_ + 0xc) + 1;
    UNLOCK();
  }
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])
            (__return_storage_ptr__,this,local_188,local_c8.m_internal,&local_108,&local_1a8,_size);
  if (local_1a0 != (long *)0x0) {
    LOCK();
    plVar1 = local_1a0 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_1a8 = (Allocation *)0x0;
      (**(code **)(*local_1a0 + 0x10))();
    }
    LOCK();
    piVar2 = (int *)((long)local_1a0 + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_1a0 != (long *)0x0) {
        (**(code **)(*local_1a0 + 8))();
      }
      local_1a0 = (long *)0x0;
    }
  }
  if (local_188._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_188 + 8),
               (VkCommandPool)local_188._0_8_);
  }
  if (local_108 != 0) {
    local_188._0_8_ = local_108;
    (*(code *)(pWStack_100->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_100,local_f8,pVStack_f0,1);
  }
  if (local_e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_e0,local_e8);
  }
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_c0,local_c8);
  }
  if (local_a8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_a8 + 8),
               (VkDescriptorSetLayout)local_a8._0_8_);
  }
  if ((long *)local_198._8_8_ != (long *)0x0) {
    LOCK();
    plVar1 = (long *)(local_198._8_8_ + 8);
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_198._0_8_ = (Allocation *)0x0;
      (**(code **)(*(long *)local_198._8_8_ + 0x10))();
    }
    LOCK();
    piVar2 = (int *)(local_198._8_8_ + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && ((long *)local_198._8_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_198._8_8_ + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	ComputeInvocationsTestInstance::iterate (void)
{
	checkExtensions();
	const DeviceInterface&				vk						= m_context.getDeviceInterface();
	const VkDevice						device					= m_context.getDevice();
	deUint32							maxSize					= 0u;

	for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
		maxSize = deMaxu32(maxSize, getComputeExecution(m_parameters[parametersNdx]));

	const VkDeviceSize					bufferSizeBytes			= static_cast<VkDeviceSize>(deAlignSize(static_cast<size_t>(sizeof(deUint32) * maxSize),
																								static_cast<size_t>(m_context.getDeviceProperties().limits.nonCoherentAtomSize)));
	de::SharedPtr<Buffer>				buffer					= Buffer::createAndAlloc(vk, device, BufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
																							 m_context.getDefaultAllocator(), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout>	descriptorSetLayout		(DescriptorSetLayoutBuilder()
			.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
			.build(vk, device));

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout(vk, device, &(*descriptorSetLayout)));

	const Unique<VkDescriptorPool>		descriptorPool			(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkDescriptorSetAllocateInfo allocateParams		=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,	// VkStructureType				sType;
		DE_NULL,										// const void*					pNext;
		*descriptorPool,								// VkDescriptorPool				descriptorPool;
		1u,												// deUint32						setLayoutCount;
		&(*descriptorSetLayout),						// const VkDescriptorSetLayout*	pSetLayouts;
	};

	const Unique<VkDescriptorSet>		descriptorSet		(allocateDescriptorSet(vk, device, &allocateParams));
	const VkDescriptorBufferInfo		descriptorInfo		=
	{
		buffer->object(),	//VkBuffer		buffer;
		0ull,				//VkDeviceSize	offset;
		bufferSizeBytes,	//VkDeviceSize	range;
	};

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo)
		.update(vk, device);

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(m_context.getUniversalQueueFamilyIndex());
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));

	return executeTest (*cmdPool, *pipelineLayout, *descriptorSet, buffer, bufferSizeBytes);
}